

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

int get_curr_stat(CHAR_DATA *ch,int stat)

{
  short sVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  CClass *pCVar5;
  int iVar6;
  AFFECT_DATA *paf_find;
  AFFECT_DATA *pAVar7;
  int iVar8;
  AFFECT_DATA *pAVar9;
  long lVar10;
  int iVar11;
  
  bVar2 = is_npc(ch);
  iVar11 = 0x19;
  lVar10 = (long)stat;
  if ((bVar2) || (0x34 < ch->level)) goto LAB_0029dd6b;
  sVar1 = *(short *)((long)ch->race * 0x88 + 0x493f90 + lVar10 * 2);
  bVar2 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                  super__Vector_impl_data._M_start[ch->race].name,"human");
  if (bVar2) {
switchD_0029dc25_default:
    sVar3 = 0x19;
    if (sVar1 < 0x19) {
      sVar3 = sVar1;
    }
    iVar11 = (int)sVar3;
  }
  else {
    pCVar5 = ch->my_class;
    if ((pCVar5 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar5 = ch->pIndexData->my_class, pCVar5 == (CClass *)0x0)))) {
      pCVar5 = CClass::GetClass(0);
    }
    CClass::GetIndex(pCVar5);
    pCVar5 = ch->my_class;
    if ((pCVar5 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar5 = ch->pIndexData->my_class, pCVar5 == (CClass *)0x0)))) {
      pCVar5 = CClass::GetClass(0);
    }
    switch(pCVar5->attr_prime) {
    case 0:
      if (stat == 0) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar11 = 0x17;
        if (iVar4 == 1) goto LAB_0029dd6b;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 5) goto LAB_0029dd6b;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 6) goto LAB_0029dd6b;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 4) goto LAB_0029dd6b;
      }
      break;
    case 1:
      if (stat == 1) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar11 = 0x17;
        if (iVar4 == 0xb) goto LAB_0029dd6b;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 10) goto LAB_0029dd6b;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 8) goto LAB_0029dd6b;
      }
      break;
    case 2:
      if (stat == 2) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar11 = 0x17;
        if (iVar4 == 9) goto LAB_0029dd6b;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 3) goto LAB_0029dd6b;
      }
      break;
    case 3:
      if (stat == 3) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar11 = 0x17;
        if (iVar4 == 7) goto LAB_0029dd6b;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 2) goto LAB_0029dd6b;
      }
      break;
    default:
      goto switchD_0029dc25_default;
    }
    iVar11 = 0x14;
  }
LAB_0029dd6b:
  iVar4 = 0;
  if (ch->fighting != (CHAR_DATA *)0x0) {
    pAVar7 = (AFFECT_DATA *)&ch->fighting->affected;
    pAVar9 = pAVar7;
    do {
      pAVar9 = pAVar9->next;
      iVar4 = 0;
      if (pAVar9 == (AFFECT_DATA *)0x0) goto LAB_0029ddac;
    } while (pAVar9->type != gsn_traitors_luck);
    do {
      pAVar7 = pAVar7->next;
    } while (pAVar7->type != gsn_traitors_luck);
    iVar4 = (uint)(pAVar7->owner == ch) * 2;
  }
LAB_0029ddac:
  iVar8 = (int)ch->mod_stat[lVar10] + (int)ch->perm_stat[lVar10];
  if (iVar8 < iVar11) {
    iVar11 = iVar8;
  }
  iVar6 = 3;
  if (2 < iVar8) {
    iVar6 = iVar11;
  }
  iVar11 = 0x19;
  if (iVar6 + iVar4 < 0x19) {
    iVar11 = iVar6 + iVar4;
  }
  return iVar11;
}

Assistant:

int get_curr_stat(CHAR_DATA *ch, int stat)
{
	AFFECT_DATA *af;
	int max;
	int mod = 0;

	if (is_npc(ch) || ch->level > LEVEL_IMMORTAL)
		max = 25;

	else
	{
		max = pc_race_table[ch->race].max_stats[stat];

		if (!str_cmp(race_table[ch->race].name, "human"))
		{
			int iClass;
			iClass = ch->Class()->GetIndex();
			switch (ch->Class()->attr_prime)
			{
				case STAT_STR:
					if (stat == STAT_STR &&
						(ch->Class()->GetIndex() == CLASS_WARRIOR || ch->Class()->GetIndex() == CLASS_ANTI_PALADIN ||
						ch->Class()->GetIndex() == CLASS_RANGER || ch->Class()->GetIndex() == CLASS_PALADIN))
						max = 23;
					else
						max = 20;
					break;
				case STAT_INT:
					if (stat == STAT_INT &&
						(ch->Class()->GetIndex() == CLASS_SORCERER || ch->Class()->GetIndex() == CLASS_NECROMANCER ||
						ch->Class()->GetIndex() == CLASS_SHAPESHIFTER))
						max = 23;
					else
						max = 20;
					break;
				case STAT_WIS:
					if (stat == STAT_WIS &&
						(ch->Class()->GetIndex() == CLASS_HEALER || ch->Class()->GetIndex() == CLASS_ZEALOT))
						max = 23;
					else
						max = 20;
					break;
				case STAT_DEX:
					if (stat == STAT_DEX &&
						(ch->Class()->GetIndex() == CLASS_ASSASSIN || ch->Class()->GetIndex() == CLASS_THIEF))
						max = 23;
					else
						max = 20;
					break;
			}
		}

		max = std::min(max, 25);
	}

	if (ch->fighting && is_affected(ch->fighting, gsn_traitors_luck))
	{
		af = affect_find(ch->fighting->affected, gsn_traitors_luck);

		if (ch == af->owner)
			mod = 2;
	}

	return std::min(URANGE(3, ch->perm_stat[stat] + ch->mod_stat[stat], max) + mod, 25);
}